

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  stbi__uint32 sVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  byte bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  long in_FS_OFFSET;
  
  if (j->spec_end == 0) {
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    if (j->succ_high != 0) {
      iVar7 = j->code_bits;
      if (iVar7 < 1) {
        stbi__grow_buffer_unsafe(j);
        iVar7 = j->code_bits;
        if (iVar7 < 1) {
          return 1;
        }
      }
      sVar1 = j->code_buffer;
      j->code_buffer = sVar1 * 2;
      j->code_bits = iVar7 + -1;
      if ((int)sVar1 < 0) {
        *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
        return 1;
      }
      return 1;
    }
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    uVar11 = j->code_buffer;
    uVar10 = (ulong)hdc->fast[uVar11 >> 0x17];
    if (uVar10 == 0xff) {
      lVar9 = 0;
      do {
        lVar8 = lVar9;
        lVar9 = lVar8 + 1;
      } while (hdc->maxcode[lVar8 + 10] <= uVar11 >> 0x10);
      iVar7 = j->code_bits;
      if (lVar9 == 8) {
        j->code_bits = iVar7 + -0x10;
      }
      else if (((int)(lVar8 + 10) <= iVar7) &&
              (uVar4 = (uVar11 >> (0x17U - (char)lVar9 & 0x1f) & stbi__bmask[lVar8 + 10]) +
                       hdc->delta[lVar8 + 10], uVar4 < 0x100)) {
        uVar10 = (ulong)uVar4;
        if ((uVar11 >> (-hdc->size[uVar10] & 0x1f) & stbi__bmask[hdc->size[uVar10]]) !=
            (uint)hdc->code[uVar10]) {
          __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                        ,0x85b,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
        }
        iVar7 = (iVar7 - (int)lVar9) + -9;
        j->code_bits = iVar7;
        j->code_buffer = uVar11 << ((byte)(lVar8 + 10) & 0x1f);
        goto LAB_001202c7;
      }
    }
    else {
      bVar6 = hdc->size[uVar10];
      iVar7 = j->code_bits - (uint)bVar6;
      if ((int)(uint)bVar6 <= j->code_bits) {
        j->code_buffer = uVar11 << (bVar6 & 0x1f);
        j->code_bits = iVar7;
LAB_001202c7:
        bVar6 = hdc->values[uVar10];
        if (bVar6 < 0x10) {
          uVar11 = 0;
          if (bVar6 != 0) {
            if (iVar7 < (int)(uint)bVar6) {
              stbi__grow_buffer_unsafe(j);
              iVar7 = j->code_bits;
            }
            uVar11 = 0;
            if ((int)(uint)bVar6 <= iVar7) {
              uVar11 = j->code_buffer;
              uVar3 = uVar11 << (bVar6 & 0x1f) | uVar11 >> 0x20 - (bVar6 & 0x1f);
              uVar4 = stbi__bmask[bVar6];
              j->code_buffer = ~uVar4 & uVar3;
              j->code_bits = iVar7 - (uint)bVar6;
              iVar7 = 0;
              if (-1 < (int)uVar11) {
                iVar7 = stbi__jbias[bVar6];
              }
              uVar11 = iVar7 + (uVar3 & uVar4);
            }
          }
          uVar4 = j->img_comp[b].dc_pred;
          if (-1 < (int)(uVar4 ^ uVar11)) {
            bVar2 = (int)(uVar11 ^ 0x7fffffff) < (int)uVar4;
            if ((int)(uVar4 & uVar11) < 0) {
              bVar2 = (int)uVar4 < (int)(-0x80000000 - uVar11);
            }
            if (bVar2) {
              pcVar5 = "bad delta";
              goto LAB_001201b8;
            }
          }
          uVar4 = uVar4 + uVar11;
          j->img_comp[b].dc_pred = uVar4;
          bVar6 = (byte)j->succ_low;
          if ((int)(1 << (bVar6 & 0x1f) ^ uVar4) < 0) {
            if (j->succ_low == 0x1f) {
              if ((int)uVar4 < 1) {
LAB_001204a0:
                *data = (short)(uVar4 << (bVar6 & 0x1f));
                return 1;
              }
            }
            else {
              uVar11 = 0x8000 >> (bVar6 & 0x1f);
              if (SBORROW4(uVar4,-uVar11) == (int)(uVar4 + uVar11) < 0) goto LAB_001204a0;
            }
          }
          else if ((int)uVar4 <= (int)(0x7fffU >> (bVar6 & 0x1f))) goto LAB_001204a0;
        }
      }
    }
  }
  pcVar5 = "can\'t merge dc and ac";
LAB_001201b8:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar5;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}